

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm_x86.h
# Opt level: O0

void asm_fusefref(ASMState *as,IRIns *ir,RegSet allow)

{
  ushort uVar1;
  IRIns *pIVar2;
  int iVar3;
  Reg RVar4;
  long lVar5;
  intptr_t ofs;
  IRIns *op1;
  RegSet allow_local;
  IRIns *ir_local;
  ASMState *as_local;
  
  (as->mrm).idx = 0x80;
  if ((ir->field_0).op1 == 0x7fff) {
    (as->mrm).ofs = (uint)(ir->field_0).op2 * 4 + -0x1018;
    (as->mrm).base = '\x0e';
    return;
  }
  (as->mrm).ofs = (uint)"\x14\x10 \nH`h \x10(04\n \n008@HPX\n\x10\x10\x10\x14"[(ir->field_0).op2];
  if ((ir->field_0).op1 < 0x8000) {
    pIVar2 = as->ir;
    uVar1 = (ir->field_0).op1;
    if ((ir->field_0).op1 == 0x7fff) {
      (as->mrm).ofs = (as->mrm).ofs + -0x1018;
      (as->mrm).base = '\x0e';
      return;
    }
    if ((((&pIVar2->field_1)[uVar1].o == '\x19') || ((&pIVar2->field_1)[uVar1].o == '\x1a')) &&
       (lVar5 = (long)pIVar2[(ulong)uVar1 + 1] - (long)&as->J[1].L, iVar3 = (int)lVar5,
       (as->mrm).ofs + lVar5 == (long)((as->mrm).ofs + iVar3))) {
      (as->mrm).ofs = iVar3 + (as->mrm).ofs;
      (as->mrm).base = '\x0e';
      return;
    }
  }
  RVar4 = ra_alloc1(as,(uint)(ir->field_0).op1,allow);
  (as->mrm).base = (uint8_t)RVar4;
  return;
}

Assistant:

static void asm_fusefref(ASMState *as, IRIns *ir, RegSet allow)
{
  lj_assertA(ir->o == IR_FLOAD || ir->o == IR_FREF,
	     "bad IR op %d", ir->o);
  as->mrm.idx = RID_NONE;
  if (ir->op1 == REF_NIL) {  /* FLOAD from GG_State with offset. */
#if LJ_GC64
    as->mrm.ofs = (int32_t)(ir->op2 << 2) - GG_OFS(dispatch);
    as->mrm.base = RID_DISPATCH;
#else
    as->mrm.ofs = (int32_t)(ir->op2 << 2) + ptr2addr(J2GG(as->J));
    as->mrm.base = RID_NONE;
#endif
    return;
  }
  as->mrm.ofs = field_ofs[ir->op2];
  if (irref_isk(ir->op1)) {
    IRIns *op1 = IR(ir->op1);
#if LJ_GC64
    if (ir->op1 == REF_NIL) {
      as->mrm.ofs -= GG_OFS(dispatch);
      as->mrm.base = RID_DISPATCH;
      return;
    } else if (op1->o == IR_KPTR || op1->o == IR_KKPTR) {
      intptr_t ofs = dispofs(as, ir_kptr(op1));
      if (checki32(as->mrm.ofs + ofs)) {
	as->mrm.ofs += (int32_t)ofs;
	as->mrm.base = RID_DISPATCH;
	return;
      }
    }
#else
    as->mrm.ofs += op1->i;
    as->mrm.base = RID_NONE;
    return;
#endif
  }
  as->mrm.base = (uint8_t)ra_alloc1(as, ir->op1, allow);
}